

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O2

cmFileLockResult __thiscall cmFileLockPool::Release(cmFileLockPool *this,string *filename)

{
  bool bVar1;
  cmFileLockResult in_RAX;
  cmFileLockResult cVar2;
  pointer ppSVar3;
  cmFileLockResult result;
  cmFileLockResult local_28;
  
  ppSVar3 = (this->FunctionScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_28 = in_RAX;
  do {
    if (ppSVar3 ==
        (this->FunctionScopes).
        super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppSVar3 = (this->FileScopes).
                super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (ppSVar3 ==
            (this->FileScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          cVar2 = ScopePool::Release(&this->ProcessScope,filename);
          return cVar2;
        }
        local_28 = ScopePool::Release(*ppSVar3,filename);
        bVar1 = cmFileLockResult::IsOk(&local_28);
        ppSVar3 = ppSVar3 + 1;
      } while (bVar1);
      return local_28;
    }
    local_28 = ScopePool::Release(*ppSVar3,filename);
    bVar1 = cmFileLockResult::IsOk(&local_28);
    ppSVar3 = ppSVar3 + 1;
  } while (bVar1);
  return local_28;
}

Assistant:

cmFileLockResult cmFileLockPool::Release(const std::string& filename)
{
  for (It i = this->FunctionScopes.begin(); i != this->FunctionScopes.end();
       ++i) {
    const cmFileLockResult result = (*i)->Release(filename);
    if (!result.IsOk()) {
      return result;
    }
  }

  for (It i = this->FileScopes.begin(); i != this->FileScopes.end(); ++i) {
    const cmFileLockResult result = (*i)->Release(filename);
    if (!result.IsOk()) {
      return result;
    }
  }

  return this->ProcessScope.Release(filename);
}